

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Point2f __thiscall pbrt::StratifiedSampler::Get2D(StratifiedSampler *this)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  uint64_t uVar4;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint64_t oldstate;
  ulong uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  uVar8 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.x;
  uVar12 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.y;
  iVar1 = this->dimension;
  iVar2 = *(int *)(Options + 4);
  this->dimension = iVar1 + 2;
  uVar9 = (long)iVar2 ^ (long)iVar1 << 0x10 ^ (ulong)uVar12 << 0x20 ^ (ulong)uVar8 << 0x30;
  uVar9 = (uVar9 >> 0x1f ^ uVar9) * 0x7fb5d329728ea185;
  lVar10 = (uVar9 >> 0x1b ^ uVar9) * -0x7e25210b43d22bb3;
  uVar3 = this->xPixelSamples;
  uVar5 = this->yPixelSamples;
  auVar15._4_4_ = uVar5;
  auVar15._0_4_ = uVar3;
  uVar11 = (uint)((ulong)lVar10 >> 0x21) ^ (uint)lVar10;
  uVar8 = this->sampleIndex;
  uVar12 = uVar5 * uVar3;
  uVar14 = uVar12 - 1 >> 1 | uVar12 - 1;
  uVar14 = uVar14 >> 2 | uVar14;
  uVar14 = uVar14 >> 4 | uVar14;
  uVar14 = uVar14 >> 8 | uVar14;
  uVar14 = uVar14 >> 0x10 | uVar14;
  do {
    uVar8 = (uVar8 ^ uVar11) * -0x1e8f76c3 ^ uVar11 >> 0x10;
    uVar8 = ((uVar8 & uVar14) >> 4 ^ uVar11 >> 8 ^ uVar8) * 0x929eb3f ^ uVar11 >> 0x17;
    uVar8 = ((uVar8 & uVar14) >> 1 ^ uVar8) * (uVar11 >> 0x1b | 1) * 0x6935fa69;
    uVar8 = ((uVar8 & uVar14) >> 0xb ^ uVar8) * 0x74dcb303;
    uVar8 = ((uVar8 & uVar14) >> 2 ^ uVar8) * -0x61afe33d;
    uVar8 = ((uVar8 & uVar14) >> 2 ^ uVar8) * -0x379f5c21 & uVar14;
    uVar8 = uVar8 >> 5 ^ uVar8;
  } while (uVar12 <= uVar8);
  if (this->jitter == true) {
    uVar9 = (this->rng).state;
    uVar4 = (this->rng).inc;
    uVar13 = uVar9 * 0x5851f42d4c957f2d + uVar4;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar9;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar13;
    auVar17 = vpunpcklqdq_avx(auVar16,auVar19);
    auVar6 = vpsrlvq_avx2(auVar17,_DAT_006015a0);
    auVar7 = vpsrlvq_avx2(auVar17,_DAT_006015b0);
    auVar17 = vpsrlq_avx(auVar17,0x3b);
    auVar17 = vpshufd_avx(auVar17,0xe8);
    (this->rng).state = uVar13 * 0x5851f42d4c957f2d + uVar4;
    auVar6 = vpshufd_avx(auVar6 ^ auVar7,0xe8);
    auVar17 = vprorvd_avx512vl(auVar6,auVar17);
    auVar17 = vcvtudq2ps_avx512vl(auVar17);
    auVar6._8_4_ = 0x2f800000;
    auVar6._0_8_ = 0x2f8000002f800000;
    auVar6._12_4_ = 0x2f800000;
    auVar17 = vmulps_avx512vl(auVar17,auVar6);
    auVar7._8_4_ = 0x3f7fffff;
    auVar7._0_8_ = 0x3f7fffff3f7fffff;
    auVar7._12_4_ = 0x3f7fffff;
    auVar17 = vminps_avx512vl(auVar17,auVar7);
  }
  else {
    auVar17._8_4_ = 0x3f000000;
    auVar17._0_8_ = 0x3f0000003f000000;
    auVar17._12_4_ = 0x3f000000;
  }
  auVar15._8_8_ = 0;
  auVar15 = vcvtdq2ps_avx(auVar15);
  uVar12 = (uVar8 + uVar11) % uVar12;
  auVar6 = vpinsrd_avx(ZEXT416((uint)((int)uVar12 % (int)uVar3)),(int)uVar12 / (int)uVar3,1);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar18._0_4_ = auVar17._0_4_ + auVar6._0_4_;
  auVar18._4_4_ = auVar17._4_4_ + auVar6._4_4_;
  auVar18._8_4_ = auVar17._8_4_ + auVar6._8_4_;
  auVar18._12_4_ = auVar17._12_4_ + auVar6._12_4_;
  auVar15 = vdivps_avx(auVar18,auVar15);
  return (Point2f)auVar15._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        dimension += 2;

        int stratum = PermutationElement(sampleIndex, SamplesPerPixel(), hash);
        int x = stratum % xPixelSamples;
        int y = stratum / xPixelSamples;
        Float dx = jitter ? rng.Uniform<Float>() : 0.5f;
        Float dy = jitter ? rng.Uniform<Float>() : 0.5f;
        return {(x + dx) / xPixelSamples, (y + dy) / yPixelSamples};
    }